

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O2

Bond * __thiscall OpenMD::SelectionManager::beginUnselectedBond(SelectionManager *this,int *i)

{
  int iVar1;
  Bond *pBVar2;
  
  iVar1 = OpenMDBitSet::firstOffBit
                    ((this->ss_).bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  *i = iVar1;
  if (iVar1 == -1) {
    pBVar2 = (Bond *)0x0;
  }
  else {
    pBVar2 = (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar1];
  }
  return pBVar2;
}

Assistant:

Bond* SelectionManager::beginUnselectedBond(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[BOND].size())) {
      if (!ss_.bitsets_[BOND][i]) {
        // check that this processor owns this bond
        if (bonds_[i] != NULL) return bonds_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[BOND].firstOffBit();
    return i == -1 ? NULL : bonds_[i];
#endif
  }